

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O3

string * format_json_value(string *__return_storage_ptr__,string *field,string *value)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  field_type fVar5;
  int iVar6;
  string *extraout_RAX;
  string *extraout_RAX_00;
  long *plVar7;
  string *extraout_RAX_01;
  string *psVar8;
  long *plVar9;
  size_type *psVar10;
  char *pcVar11;
  size_type sVar12;
  string escaped;
  string *local_78;
  undefined8 local_70;
  string local_68;
  long local_48;
  long lStack_40;
  char local_38 [8];
  
  fVar5 = test::get_field_type(field);
  if (fVar5 == BOOL) {
    iVar6 = std::__cxx11::string::compare((char *)value);
    pcVar11 = "true";
    if (iVar6 == 0) {
      pcVar11 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar11,pcVar11 + (ulong)(iVar6 == 0) + 4);
    return extraout_RAX;
  }
  if (fVar5 == STRING) {
    pcVar2 = (value->_M_dataplus)._M_p;
    sVar3 = value->_M_string_length;
    local_78 = &local_68;
    local_70 = 0;
    local_68._M_dataplus._M_p._0_1_ = 0;
    if (sVar3 != 0) {
      sVar12 = 0;
      do {
        cVar1 = pcVar2[sVar12];
        if ((cVar1 == '\\') || (cVar1 == '\"')) {
          std::__cxx11::string::append((char *)&local_78);
        }
        else if (cVar1 < ' ') {
          snprintf(local_38,8,"\\u%04x");
          std::__cxx11::string::append((char *)&local_78);
        }
        else {
          std::__cxx11::string::push_back((char)&local_78);
        }
        sVar12 = sVar12 + 1;
      } while (sVar3 != sVar12);
    }
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x140824);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_48 = *plVar9;
      lStack_40 = plVar7[3];
      local_68.field_2._M_allocated_capacity = (size_type)&local_48;
    }
    else {
      local_48 = *plVar9;
      local_68.field_2._M_allocated_capacity = (size_type)(long *)*plVar7;
    }
    local_68.field_2._8_8_ = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_68.field_2._M_local_buf);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar4 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((long *)local_68.field_2._M_allocated_capacity != &local_48) {
      operator_delete((void *)local_68.field_2._M_allocated_capacity,local_48 + 1);
    }
    psVar8 = &local_68;
    if (local_78 != psVar8) {
      operator_delete(local_78,CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                        local_68._M_dataplus._M_p._0_1_) + 1);
      psVar8 = extraout_RAX_01;
    }
    return psVar8;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + value->_M_string_length);
  return extraout_RAX_00;
}

Assistant:

static std::string format_json_value(const std::string & field, const std::string & value) {
    switch (test::get_field_type(field)) {
        case test::STRING:
            return "\"" + escape_json(value) + "\"";
        case test::BOOL:
            return value == "0" ? "false" : "true";
        default:
            return value;
    }
}